

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

FT_Error af_latin_hints_detect_features
                   (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  undefined4 local_28;
  FT_Error error;
  AF_Dimension dim_local;
  AF_WidthRec *widths_local;
  FT_UInt width_count_local;
  AF_GlyphHints hints_local;
  
  local_28 = af_latin_hints_compute_segments(hints,dim);
  if (local_28 == 0) {
    af_latin_hints_link_segments(hints,width_count,widths,dim);
    local_28 = af_latin_hints_compute_edges(hints,dim);
  }
  return local_28;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_detect_features( AF_GlyphHints  hints,
                                  FT_UInt        width_count,
                                  AF_WidthRec*   widths,
                                  AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_latin_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_latin_hints_link_segments( hints, width_count, widths, dim );

      error = af_latin_hints_compute_edges( hints, dim );
    }

    return error;
  }